

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

SequenceReset *
anon_unknown.dwarf_334836::createT11SequenceReset
          (SequenceReset *__return_storage_ptr__,char *sender,char *target,int seq,int newSeq)

{
  undefined1 *this;
  int iVar1;
  FieldBase FStack_68;
  
  FIXT11::SequenceReset::SequenceReset(__return_storage_ptr__);
  FIX::NewSeqNo::NewSeqNo((NewSeqNo *)&FStack_68,0xb);
  FIXT11::SequenceReset::set(__return_storage_ptr__,(NewSeqNo *)&FStack_68);
  FIX::FieldBase::~FieldBase(&FStack_68);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",5);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&FStack_68,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&FStack_68,true);
  FIX::FieldBase::~FieldBase(&FStack_68);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&FStack_68,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&FStack_68,true);
  FIX::FieldBase::~FieldBase(&FStack_68);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::SequenceReset createT11SequenceReset(const char *sender, const char *target, int seq, int newSeq) {
  FIXT11::SequenceReset sequenceReset;
  sequenceReset.set(NewSeqNo(newSeq));
  fillHeader(sequenceReset.getHeader(), sender, target, seq);
  sequenceReset.getHeader().setField(BodyLength(sequenceReset.bodyLength()));
  sequenceReset.getTrailer().setField(CheckSum(sequenceReset.checkSum()));
  return sequenceReset;
}